

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

void __thiscall
AutoArgParse::ParseException::ParseException
          (ParseException *this,ParseFailureReason failureReason,string *errorMessage)

{
  *(undefined ***)this = &PTR__ParseException_00110a20;
  this->failureReason = failureReason;
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)errorMessage);
  return;
}

Assistant:

ParseException(ParseFailureReason failureReason, std::string errorMessage)
        : failureReason(failureReason), errorMessage(errorMessage) {}